

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::eventsChecker::ZEeventsChecker::zeEventDestroyEpilogue
          (ZEeventsChecker *this,ze_event_handle_t hEvent,ze_result_t result)

{
  iterator iVar1;
  ze_event_handle_t local_10;
  
  if (result == ZE_RESULT_SUCCESS) {
    local_10 = hEvent;
    iVar1 = std::
            _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->eventToDagID)._M_h,&local_10);
    if (iVar1.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>.
        _M_cur != (__node_type *)0x0) {
      std::
      _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->eventToDagID)._M_h,&local_10);
    }
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
eventsChecker::ZEeventsChecker::zeEventDestroyEpilogue(
    ze_event_handle_t hEvent, ///< [in][release] handle of event object to destroy
    ze_result_t result
) {
    if(result != ZE_RESULT_SUCCESS) {
        return ZE_RESULT_SUCCESS;
    }

    if (eventToDagID.find(hEvent) != eventToDagID.end()) {
        // Delete event from eventToDagID but not from the dagIDToAction map as it may be needed for printing the discription of the action when printing path in the DAG.
        eventToDagID.erase(hEvent);
    }

    return ZE_RESULT_SUCCESS;
}